

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O1

void vkt::texture::util::wrapCubemapCorner
               (IVec2 *coord,IVec2 *size,int faceNdx,int *adjacentFace1,int *adjacentFace2,
               IVec2 *cornerCoord0,IVec2 *cornerCoord1,IVec2 *cornerCoord2)

{
  int edgeNdx;
  long lVar1;
  long lVar2;
  int i;
  uint uVar3;
  int iVar4;
  long lVar5;
  int local_80 [4];
  undefined8 local_70;
  uint local_64 [5];
  IVec2 cornerFactor;
  Vector<int,_2> res;
  Vector<int,_2> res_1;
  int cornerEdges [2];
  int faceCorners [3];
  IVec2 *cornerCoords [3];
  
  iVar4 = coord->m_data[0];
  if (((-1 < iVar4) || (local_64[0] = 0, -1 < coord->m_data[1])) &&
     ((iVar4 < 1 || (local_64[0] = 1, -1 < coord->m_data[1])))) {
    local_64[0] = (0 < coord->m_data[1] && 0 < iVar4) ^ 3;
  }
  local_64[1] = local_64[0] - 1 & 3;
  local_64[2] = local_64[0];
  local_64[3] = 0;
  local_64[4] = 0;
  lVar1 = 0;
  lVar5 = (long)faceNdx * 0x10;
  do {
    lVar2 = (long)(int)local_64[lVar1];
    iVar4 = *(int *)((anonymous_namespace)::adjacentEdges + lVar2 * 4 + lVar5);
    if ((*(int *)((anonymous_namespace)::adjacentEdgeDirs + lVar2 * 4 + lVar5) == -1) !=
        (1 < iVar4 != 1 < lVar2)) {
      uVar3 = iVar4 + 4;
      if (-1 < (int)(iVar4 + 1U)) {
        uVar3 = iVar4 + 1U;
      }
      iVar4 = (iVar4 - (uVar3 & 0xfffffffc)) + 1;
    }
    (&cornerFactor)[-1].m_data[lVar1] = iVar4;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  *adjacentFace1 = *(int *)((anonymous_namespace)::adjacentFaces + (ulong)local_64[0] * 4 + lVar5);
  *adjacentFace2 = *(int *)((anonymous_namespace)::adjacentFaces + (ulong)local_64[1] * 4 + lVar5);
  res.m_data = (int  [2])cornerCoord0;
  uVar3 = local_64[(long)faceNdx + 2];
  lVar1 = 0;
  do {
    local_80[0] = 0;
    local_80[1] = 0;
    switch(uVar3) {
    case 0:
      local_80[0] = 0;
      local_80[1] = 0;
      break;
    case 1:
      local_80[0] = 1;
      local_80[1] = 0;
      break;
    case 2:
      local_80[0] = 1;
      local_80[1] = 1;
      break;
    case 3:
      local_80[0] = 0;
      local_80[1] = 1;
    }
    lVar5 = 0;
    do {
      cornerFactor.m_data[lVar5] = 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    local_80[2] = 0;
    local_80[3] = 0;
    lVar5 = 0;
    do {
      local_80[lVar5 + 2] = size->m_data[lVar5] - cornerFactor.m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    local_70 = 0;
    lVar5 = 0;
    do {
      *(int *)((long)&local_70 + lVar5 * 4) = local_80[lVar5 + 2] * local_80[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    **(undefined8 **)(&res)[lVar1].m_data = local_70;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void wrapCubemapCorner (const IVec2&	coord,
						const IVec2&	size,
						const int		faceNdx,
						int&			adjacentFace1,
						int&			adjacentFace2,
						IVec2&			cornerCoord0,
						IVec2&			cornerCoord1,
						IVec2&			cornerCoord2)
{
	int cornerNdx = -1;

	if (coord[0] < 0 && coord[1] < 0)
	{
		cornerNdx = 0;
	}
	else if (coord[0] > 0 && coord[1] < 0)
	{
		cornerNdx = 1;
	}
	else if (coord[0] > 0 && coord[1] > 0)
	{
		cornerNdx = 2;
	}
	else
	{
		cornerNdx = 3;
	}

	const int cornerEdges[2] = {cornerNdx, (int) ((cornerNdx + 3) % 4)};

	int		  faceCorners[3] = {cornerNdx, 0, 0};

	for (int edgeNdx = 0; edgeNdx < 2; ++edgeNdx)
	{
		const int faceEdge = adjacentEdges[faceNdx][cornerEdges[edgeNdx]];

		bool isFlipped = (adjacentEdgeDirs[faceNdx][cornerEdges[edgeNdx]] == -1);

		if ((cornerEdges[edgeNdx] > 1) != (faceEdge > 1))
		{
			isFlipped = !isFlipped;
		}

		if (isFlipped)
		{
			faceCorners[edgeNdx + 1] = (faceEdge + 1) % 4;
		}
		else
		{
			faceCorners[edgeNdx + 1] = faceEdge;
		}
	}

	adjacentFace1 = adjacentFaces[faceNdx][cornerEdges[0]];
	adjacentFace2 = adjacentFaces[faceNdx][cornerEdges[1]];

	IVec2* cornerCoords[3] = {&cornerCoord0, &cornerCoord1, &cornerCoord2};

	for (int ndx = 0; ndx < 3; ++ndx)
	{
		IVec2 cornerFactor;

		switch (faceCorners[faceNdx])
		{
			case 0:
				cornerFactor = IVec2(0, 0);
				break;

			case 1:
				cornerFactor = IVec2(1, 0);
				break;

			case 2:
				cornerFactor = IVec2(1, 1);
				break;

			case 3:
				cornerFactor = IVec2(0, 1);
				break;

			default:
				break;
		}

	    *cornerCoords[ndx] = cornerFactor * (size - IVec2(1));
	}
}